

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cui.hpp
# Opt level: O0

void __thiscall ghc::cui::application::handle_resize(application *this)

{
  bool bVar1;
  element_type *peVar2;
  int local_60;
  int local_5c;
  undefined1 local_40 [8];
  shared_ptr<ghc::cui::window> w;
  weak_ptr<ghc::cui::window> *window;
  iterator __end2;
  iterator __begin2;
  vector<std::weak_ptr<ghc::cui::window>,_std::allocator<std::weak_ptr<ghc::cui::window>_>_>
  *__range2;
  application *this_local;
  
  window_base::clear(&this->super_window_base);
  if (_stdscr == 0) {
    local_5c = -1;
  }
  else {
    local_5c = *(short *)(_stdscr + 4) + 1;
  }
  (this->super_window_base)._height = local_5c;
  if (_stdscr == 0) {
    local_60 = -1;
  }
  else {
    local_60 = *(short *)(_stdscr + 6) + 1;
  }
  (this->super_window_base)._width = local_60;
  (*(this->super_window_base)._vptr_window_base[5])
            (this,(ulong)(uint)(this->super_window_base)._width,
             (ulong)(uint)(this->super_window_base)._height);
  __end2 = std::
           vector<std::weak_ptr<ghc::cui::window>,_std::allocator<std::weak_ptr<ghc::cui::window>_>_>
           ::begin(&this->_windows);
  window = (weak_ptr<ghc::cui::window> *)
           std::
           vector<std::weak_ptr<ghc::cui::window>,_std::allocator<std::weak_ptr<ghc::cui::window>_>_>
           ::end(&this->_windows);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::weak_ptr<ghc::cui::window>_*,_std::vector<std::weak_ptr<ghc::cui::window>,_std::allocator<std::weak_ptr<ghc::cui::window>_>_>_>
                                     *)&window), bVar1) {
    w.super___shared_ptr<ghc::cui::window,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         __gnu_cxx::
         __normal_iterator<std::weak_ptr<ghc::cui::window>_*,_std::vector<std::weak_ptr<ghc::cui::window>,_std::allocator<std::weak_ptr<ghc::cui::window>_>_>_>
         ::operator*(&__end2);
    std::weak_ptr<ghc::cui::window>::lock((weak_ptr<ghc::cui::window> *)local_40);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_40);
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<ghc::cui::window,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ghc::cui::window,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_40);
      (*(peVar2->super_window_base)._vptr_window_base[4])
                (peVar2,(ulong)(uint)(this->super_window_base)._width,
                 (ulong)(uint)(this->super_window_base)._height);
    }
    std::shared_ptr<ghc::cui::window>::~shared_ptr((shared_ptr<ghc::cui::window> *)local_40);
    __gnu_cxx::
    __normal_iterator<std::weak_ptr<ghc::cui::window>_*,_std::vector<std::weak_ptr<ghc::cui::window>,_std::allocator<std::weak_ptr<ghc::cui::window>_>_>_>
    ::operator++(&__end2);
  }
  refresh();
  return;
}

Assistant:

GHC_INLINE void application::handle_resize()
{
    clear();
    getmaxyx(stdscr, _height, _width);
    on_resize(_width, _height);
    for (const auto& window : _windows) {
        auto w = window.lock();
        if (w) {
            w->on_resize(_width, _height);
        }
    }
    ::refresh();
}